

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

bool __thiscall
Fossilize::ExternalReplayer::Impl::get_failed
          (Impl *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *failed,size_t *count,Hash *hashes)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  value_type *mod;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  Hash *hashes_local;
  size_t *count_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *failed_local;
  Impl *this_local;
  
  if (hashes == (Hash *)0x0) {
    sVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size(failed);
    *count = sVar4;
    this_local._7_1_ = true;
  }
  else {
    sVar4 = *count;
    sVar2 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size(failed);
    if (sVar4 == sVar2) {
      __end2 = std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::begin(failed);
      mod = (value_type *)
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::end(failed);
      __range2 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)hashes;
      while( true ) {
        bVar1 = std::__detail::operator!=
                          (&__end2.super__Node_iterator_base<unsigned_long,_false>,
                           (_Node_iterator_base<unsigned_long,_false> *)&mod);
        if (!bVar1) break;
        pvVar3 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end2)
        ;
        (__range2->_M_h)._M_buckets = (__buckets_ptr)*pvVar3;
        std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end2);
        __range2 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&(__range2->_M_h)._M_bucket_count;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExternalReplayer::Impl::get_failed(const std::unordered_set<Hash> &failed, size_t *count, Hash *hashes) const
{
	if (hashes)
	{
		if (*count != failed.size())
			return false;

		for (auto &mod : failed)
			*hashes++ = mod;
		return true;
	}
	else
	{
		*count = failed.size();
		return true;
	}
}